

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_open_debugfile_by_buildid
              (backtrace_state *state,char *buildid_data,size_t buildid_size,
              backtrace_error_callback error_callback,void *data)

{
  int iVar1;
  char *filename;
  char *pcVar2;
  size_t sVar3;
  byte bVar4;
  char cVar5;
  int local_44;
  size_t sStack_40;
  int does_not_exist;
  backtrace_state *local_38;
  
  sStack_40 = buildid_size * 2 + 0x21;
  local_38 = state;
  filename = (char *)tcmalloc_backtrace_alloc(state,sStack_40,error_callback,data);
  if (filename == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    builtin_strncpy(filename,"/usr/lib/debug/.build-id/",0x19);
    pcVar2 = filename + 0x19;
    if (buildid_size != 0) {
      sVar3 = 0;
      do {
        bVar4 = buildid_data[sVar3];
        cVar5 = (bVar4 >> 4) + 0x57;
        if (bVar4 < 0xa0) {
          cVar5 = (bVar4 >> 4) + 0x30;
        }
        *pcVar2 = cVar5;
        bVar4 = bVar4 & 0xf;
        cVar5 = bVar4 + 0x57;
        if (bVar4 < 10) {
          cVar5 = bVar4 + 0x30;
        }
        pcVar2[1] = cVar5;
        if (sVar3 == 0) {
          pcVar2[2] = '/';
          pcVar2 = pcVar2 + 3;
        }
        else {
          pcVar2 = pcVar2 + 2;
        }
        sVar3 = sVar3 + 1;
      } while (buildid_size != sVar3);
    }
    builtin_strncpy(pcVar2,".debug",7);
    iVar1 = tcmalloc_backtrace_open(filename,error_callback,data,&local_44);
    tcmalloc_backtrace_free(local_38,filename,sStack_40,error_callback,data);
  }
  return iVar1;
}

Assistant:

static int
elf_open_debugfile_by_buildid (struct backtrace_state *state,
			       const char *buildid_data, size_t buildid_size,
			       backtrace_error_callback error_callback,
			       void *data)
{
  const char * const prefix = SYSTEM_BUILD_ID_DIR;
  const size_t prefix_len = strlen (prefix);
  const char * const suffix = ".debug";
  const size_t suffix_len = strlen (suffix);
  size_t len;
  char *bd_filename;
  char *t;
  size_t i;
  int ret;
  int does_not_exist;

  len = prefix_len + buildid_size * 2 + suffix_len + 2;
  bd_filename = backtrace_alloc (state, len, error_callback, data);
  if (bd_filename == NULL)
    return -1;

  t = bd_filename;
  memcpy (t, prefix, prefix_len);
  t += prefix_len;
  for (i = 0; i < buildid_size; i++)
    {
      unsigned char b;
      unsigned char nib;

      b = (unsigned char) buildid_data[i];
      nib = (b & 0xf0) >> 4;
      *t++ = nib < 10 ? '0' + nib : 'a' + nib - 10;
      nib = b & 0x0f;
      *t++ = nib < 10 ? '0' + nib : 'a' + nib - 10;
      if (i == 0)
	*t++ = '/';
    }
  memcpy (t, suffix, suffix_len);
  t[suffix_len] = '\0';

  ret = backtrace_open (bd_filename, error_callback, data, &does_not_exist);

  backtrace_free (state, bd_filename, len, error_callback, data);

  /* gdb checks that the debuginfo file has the same build ID note.
     That seems kind of pointless to me--why would it have the right
     name but not the right build ID?--so skipping the check.  */

  return ret;
}